

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decomposition.hpp
# Opt level: O2

void diy::decompose<diy::Bounds<int>>
               (int dim,int rank,Bounds<int> *domain,StaticAssigner *assigner,Master *master,
               BoolVector *share_face,BoolVector wrap,CoordinateVector ghosts,DivisionsVector divs)

{
  int nblocks_;
  _Vector_base<int,_std::allocator<int>_> local_1c0;
  _Vector_base<int,_std::allocator<int>_> local_1a8;
  _Bvector_base<std::allocator<bool>_> local_190;
  _Bvector_base<std::allocator<bool>_> local_168;
  RegularDecomposer<diy::Bounds<int>_> local_140;
  
  nblocks_ = (assigner->super_Assigner).nblocks_;
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)&local_168,share_face);
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)&local_190,
             (vector<bool,_std::allocator<bool>_> *)
             wrap.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_start.super__Bit_iterator_base._M_p);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_1a8,
             (vector<int,_std::allocator<int>_> *)
             wrap.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_start.super__Bit_iterator_base._8_8_);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_1c0,
             (vector<int,_std::allocator<int>_> *)
             wrap.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_finish.super__Bit_iterator_base._M_p);
  RegularDecomposer<diy::Bounds<int>_>::RegularDecomposer
            (&local_140,dim,domain,nblocks_,(BoolVector *)&local_168,(BoolVector *)&local_190,
             (CoordinateVector *)&local_1a8,(DivisionsVector *)&local_1c0);
  RegularDecomposer<diy::Bounds<int>_>::decompose(&local_140,rank,assigner,master);
  RegularDecomposer<diy::Bounds<int>_>::~RegularDecomposer(&local_140);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_1c0);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_1a8);
  std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base(&local_190);
  std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base(&local_168);
  return;
}

Assistant:

void decompose(int                    dim,
                 int                    rank,
                 const Bounds&          domain,
                 const StaticAssigner&  assigner,
                 Master&                master,
                 typename RegularDecomposer<Bounds>::BoolVector       share_face = typename RegularDecomposer<Bounds>::BoolVector(),
                 typename RegularDecomposer<Bounds>::BoolVector       wrap       = typename RegularDecomposer<Bounds>::BoolVector(),
                 typename RegularDecomposer<Bounds>::CoordinateVector ghosts     = typename RegularDecomposer<Bounds>::CoordinateVector(),
                 typename RegularDecomposer<Bounds>::DivisionsVector  divs       = typename RegularDecomposer<Bounds>::DivisionsVector())
  {
    RegularDecomposer<Bounds>(dim, domain, assigner.nblocks(), share_face, wrap, ghosts, divs).decompose(rank, assigner, master);
  }